

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterquietus.cpp
# Opt level: O2

int AF_A_DropWeaponPieces(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  AActor *pAVar7;
  DObject *this;
  int iVar8;
  char *__assertion;
  PClassActor *type;
  int iVar9;
  PClassActor *ti;
  PClassActor *local_70;
  PClassActor *local_68;
  DVector3 local_58;
  double local_38;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      this = (DObject *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (this == (DObject *)0x0) {
LAB_005398c0:
          this = (DObject *)0x0;
        }
        else {
          bVar5 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
          if (!bVar5) {
            __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_00539b09;
          }
        }
        if (numparam == 1) {
          __assertion = "(paramnum) < numparam";
        }
        else {
          if (param[1].field_0.field_3.Type == '\x03') {
            local_70 = (PClassActor *)param[1].field_0.field_1.a;
            if (param[1].field_0.field_1.atag == 1) {
              if (local_70 == (PClassActor *)0x0) {
LAB_00539921:
                local_70 = (PClassActor *)0x0;
              }
              else {
                bVar5 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)local_70);
                if (!bVar5) {
                  __assertion = "p1 == NULL || p1->IsDescendantOf(RUNTIME_CLASS(AActor))";
                  goto LAB_00539b22;
                }
              }
              if ((uint)numparam < 3) {
                __assertion = "(paramnum) < numparam";
              }
              else {
                if (param[2].field_0.field_3.Type == '\x03') {
                  ti = (PClassActor *)param[2].field_0.field_1.a;
                  if (param[2].field_0.field_1.atag == 1) {
                    if (ti == (PClassActor *)0x0) {
LAB_0053997c:
                      ti = (PClassActor *)0x0;
                    }
                    else {
                      bVar5 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)ti);
                      if (!bVar5) {
                        __assertion = "p2 == NULL || p2->IsDescendantOf(RUNTIME_CLASS(AActor))";
                        goto LAB_00539b3b;
                      }
                    }
                    if (numparam == 3) {
                      __assertion = "(paramnum) < numparam";
                    }
                    else {
                      if (param[3].field_0.field_3.Type == '\x03') {
                        local_68 = (PClassActor *)param[3].field_0.field_1.a;
                        if (param[3].field_0.field_1.atag == 1) {
                          if (local_68 != (PClassActor *)0x0) {
                            bVar5 = PClass::IsAncestorOf
                                              (AActor::RegistrationInfo.MyClass,(PClass *)local_68);
                            if (bVar5) goto LAB_005399dc;
                            __assertion = "p3 == NULL || p3->IsDescendantOf(RUNTIME_CLASS(AActor))";
                            goto LAB_00539b54;
                          }
                        }
                        else if (local_68 != (PClassActor *)0x0) goto LAB_00539af9;
                        local_68 = (PClassActor *)0x0;
LAB_005399dc:
                        iVar8 = 0;
                        for (iVar9 = 0; iVar9 != 0x168; iVar9 = iVar9 + 0x78) {
                          type = ti;
                          if (iVar8 != 1) {
                            type = local_68;
                          }
                          if (iVar8 == 0) {
                            type = local_70;
                          }
                          if (type != (PClassActor *)0x0) {
                            local_58.X = *(double *)&this[1].ObjectFlags;
                            local_58.Y = (double)this[2]._vptr_DObject;
                            local_58.Z = (double)this[2].Class;
                            pAVar7 = Spawn(type,&local_58,ALLOW_REPLACE);
                            if (pAVar7 != (AActor *)0x0) {
                              local_38 = (double)iVar9;
                              TAngle<double>::ToVector((TAngle<double> *)&local_58,1.0);
                              (pAVar7->Vel).Z = (double)this[4].GCNext;
                              dVar3 = (double)this[4].Class + local_58.X;
                              dVar4 = (double)this[4].ObjNext + local_58.Y;
                              auVar2._8_4_ = SUB84(dVar4,0);
                              auVar2._0_8_ = dVar3;
                              auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
                              (pAVar7->Vel).X = dVar3;
                              (pAVar7->Vel).Y = (double)auVar2._8_8_;
                              pbVar1 = (byte *)((long)&(pAVar7->flags).Value + 2);
                              *pbVar1 = *pbVar1 | 2;
                              if (iVar8 == 0) {
                                uVar6 = FRandom::operator()(&pr_quietusdrop);
                                iVar8 = (uVar6 & 1) + 1;
                              }
                              else {
                                iVar8 = 3 - iVar8;
                              }
                            }
                          }
                        }
                        return 0;
                      }
LAB_00539af9:
                      __assertion = 
                      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ;
                    }
LAB_00539b54:
                    uVar6 = 0x20;
                    goto LAB_00539b64;
                  }
                  if (ti == (PClassActor *)0x0) goto LAB_0053997c;
                }
                __assertion = 
                "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ;
              }
LAB_00539b3b:
              uVar6 = 0x1f;
              goto LAB_00539b64;
            }
            if (local_70 == (PClassActor *)0x0) goto LAB_00539921;
          }
          __assertion = 
          "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
          ;
        }
LAB_00539b22:
        uVar6 = 0x1e;
        goto LAB_00539b64;
      }
      if (this == (DObject *)0x0) goto LAB_005398c0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00539b09:
  uVar6 = 0x1d;
LAB_00539b64:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                ,uVar6,"int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_DropWeaponPieces)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(p1, AActor);
	PARAM_CLASS(p2, AActor);
	PARAM_CLASS(p3, AActor);

	for (int i = 0, j = 0; i < 3; ++i)
	{
		PClassActor *cls = j == 0 ?  p1 : j == 1 ? p2 : p3;
		if (cls)
		{
			AActor *piece = Spawn (cls, self->Pos(), ALLOW_REPLACE);
			if (piece != NULL)
			{
				piece->Vel = self->Vel + DAngle(i*120.).ToVector(1);
				piece->flags |= MF_DROPPED;
				j = (j == 0) ? (pr_quietusdrop() & 1) + 1 : 3-j;
			}
		}
	}
	return 0;
}